

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setWindowState(QWidget *this,WindowStates newstate)

{
  long lVar1;
  ushort uVar2;
  Representation RVar3;
  undefined2 uVar4;
  bool bVar5;
  Int IVar6;
  QWidgetPrivate *this_00;
  QRect *pQVar7;
  QTLWExtra *pQVar8;
  Int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  WindowStates oldstate;
  QWindowStateChangeEvent e;
  WindowState in_stack_ffffffffffffff8c;
  QWidgetPrivate *in_stack_ffffffffffffff90;
  QFlagsStorage<Qt::WindowState> other;
  QWidgetPrivate *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 on;
  WindowState in_stack_ffffffffffffffac;
  QFlagsStorageHelper<Qt::WindowState,_4> local_3c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_38;
  QFlagsStorageHelper<Qt::WindowState,_4> local_34;
  QFlagsStorageHelper<Qt::WindowState,_4> local_30;
  Int local_2c;
  QFlagsStorage<Qt::WindowState> local_28;
  QFlagsStorage<Qt::WindowState> local_24;
  QWindowStateChangeEvent local_20 [6];
  undefined2 uVar9;
  WId in_stack_ffffffffffffffe8;
  QWidget *in_stack_fffffffffffffff0;
  
  on = (undefined1)((uint)in_stack_ffffffffffffffa8 >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24.i = in_ESI;
  this_00 = d_func((QWidget *)0x36824e);
  local_28.i = 0xaaaaaaaa;
  local_28.i = (Int)windowState((QWidget *)in_stack_ffffffffffffff90);
  bVar5 = QFlags<Qt::WindowState>::testFlag
                    ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c)
  ;
  if (bVar5) {
    QFlags<Qt::WindowState>::setFlag
              ((QFlags<Qt::WindowState> *)this_00,in_stack_ffffffffffffffac,(bool)on);
  }
  local_2c = local_28.i;
  local_30.super_QFlagsStorage<Qt::WindowState>.i =
       (QFlagsStorage<Qt::WindowState>)(QFlagsStorage<Qt::WindowState>)local_24.i;
  bVar5 = ::operator==((QFlags<Qt::WindowState>)local_28.i,(QFlags<Qt::WindowState>)local_24.i);
  if (!bVar5) {
    bVar5 = isWindow((QWidget *)in_stack_ffffffffffffff90);
    uVar9 = (undefined2)((ulong)_local_20 >> 0x30);
    if ((bVar5) &&
       (bVar5 = testAttribute((QWidget *)in_stack_ffffffffffffff98,
                              (WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20)),
       uVar4 = uVar9, !bVar5)) {
      uVar2 = (ushort)uVar9 >> 8;
      create(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,SUB21(uVar2,0),SUB21(uVar4,0));
    }
    IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
    *(uint *)&in_RDI->data->field_0x10 =
         *(uint *)&in_RDI->data->field_0x10 & 0xfffffff0 | IVar6 & 0xf;
    *(uint *)&in_RDI->data->field_0x10 = *(uint *)&in_RDI->data->field_0x10 & 0xfffff7ff | 0x800;
    bVar5 = isWindow((QWidget *)in_stack_ffffffffffffff90);
    if (bVar5) {
      bVar5 = testAttribute((QWidget *)in_stack_ffffffffffffff98,
                            (WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      if ((!bVar5) && (bVar5 = isVisible((QWidget *)0x368355), !bVar5)) {
        adjustSize((QWidget *)in_stack_ffffffffffffff90);
      }
      QWidgetPrivate::createTLExtra(in_stack_ffffffffffffff98);
      other.i = (Int)in_stack_ffffffffffffff98;
      local_38.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                         (enum_type)in_stack_ffffffffffffff90);
      QFlags<Qt::WindowState>::operator|
                ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_34.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QFlags<Qt::WindowState>::operator&
                     ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffff90,
                      (QFlags<Qt::WindowState>)other.i);
      bVar5 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_34);
      if (bVar5) {
        pQVar7 = geometry(in_RDI);
        pQVar8 = QWidgetPrivate::topData(in_stack_ffffffffffffff90);
        RVar3.m_i = (pQVar7->y1).m_i;
        (pQVar8->normalGeometry).x1 = (Representation)(pQVar7->x1).m_i;
        (pQVar8->normalGeometry).y1 = (Representation)RVar3.m_i;
        RVar3.m_i = (pQVar7->y2).m_i;
        (pQVar8->normalGeometry).x2 = (Representation)(pQVar7->x2).m_i;
        (pQVar8->normalGeometry).y2 = (Representation)RVar3.m_i;
      }
      in_stack_ffffffffffffff90 =
           (QWidgetPrivate *)windowHandle((QWidget *)in_stack_ffffffffffffff90);
      QFlags<Qt::WindowState>::operator&
                ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      QWindow::setWindowStates((QFlags_conflict1 *)in_stack_ffffffffffffff90);
    }
    *(uint *)&in_RDI->data->field_0x10 = *(uint *)&in_RDI->data->field_0x10 & 0xfffff7ff;
    local_3c.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorage<Qt::WindowState>)
         QFlags<Qt::WindowState>::operator&
                   ((QFlags<Qt::WindowState> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
    if (IVar6 != 0) {
      activateWindow((QWidget *)in_stack_ffffffffffffff90);
    }
    _local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QWindowStateChangeEvent::QWindowStateChangeEvent
              (local_20,(QFlags_conflict1 *)(ulong)local_28.i,false);
    QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)local_20);
    QWindowStateChangeEvent::~QWindowStateChangeEvent(local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setWindowState(Qt::WindowStates newstate)
{
    Q_D(QWidget);
    Qt::WindowStates oldstate = windowState();
    if (newstate.testFlag(Qt::WindowMinimized)) // QTBUG-46763
       newstate.setFlag(Qt::WindowActive, false);
    if (oldstate == newstate)
        return;
    if (isWindow() && !testAttribute(Qt::WA_WState_Created))
        create();

    data->window_state = newstate;
    data->in_set_window_state = 1;
    if (isWindow()) {
        // Ensure the initial size is valid, since we store it as normalGeometry below.
        if (!testAttribute(Qt::WA_Resized) && !isVisible())
            adjustSize();

        d->createTLExtra();
        if (!(oldstate & (Qt::WindowMinimized | Qt::WindowMaximized | Qt::WindowFullScreen)))
            d->topData()->normalGeometry = geometry();

        Q_ASSERT(windowHandle());
        windowHandle()->setWindowStates(newstate & ~Qt::WindowActive);
    }
    data->in_set_window_state = 0;

    if (newstate & Qt::WindowActive)
        activateWindow();

    QWindowStateChangeEvent e(oldstate);
    QCoreApplication::sendEvent(this, &e);
}